

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void __thiscall MIDIStreamer::~MIDIStreamer(MIDIStreamer *this)

{
  MIDIStreamer *this_local;
  
  (this->super_MusInfo)._vptr_MusInfo = (_func_int **)&PTR__MIDIStreamer_009f0898;
  (*(this->super_MusInfo)._vptr_MusInfo[7])();
  if ((this->MIDI != (MIDIDevice *)0x0) && (this->MIDI != (MIDIDevice *)0x0)) {
    (*this->MIDI->_vptr_MIDIDevice[1])();
  }
  FString::~FString(&this->Args);
  FString::~FString(&this->DumpFilename);
  MusInfo::~MusInfo(&this->super_MusInfo);
  return;
}

Assistant:

MIDIStreamer::~MIDIStreamer()
{
	Stop();
#ifdef _WIN32
	if (ExitEvent != NULL)
	{
		CloseHandle(ExitEvent);
	}
	if (BufferDoneEvent != NULL)
	{
		CloseHandle(BufferDoneEvent);
	}
#endif
	if (MIDI != NULL)
	{
		delete MIDI;
	}
}